

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

Literal * __thiscall wasm::Literal::truncSatToSI32(Literal *__return_storage_ptr__,Literal *this)

{
  uintptr_t uVar1;
  bool bVar2;
  float fVar3;
  double dVar4;
  int32_t iVar5;
  Literal local_50;
  Literal local_38;
  double local_20;
  
  uVar1 = (this->type).id;
  if (uVar1 == 5) {
    Literal(&local_50,this);
    castToI64(&local_38,&local_50);
    dVar4 = (double)geti64(&local_38);
    local_20 = dVar4;
    if (NAN(dVar4)) {
      iVar5 = 0;
    }
    else {
      bVar2 = isInRangeI32TruncS((int64_t)dVar4);
      if (bVar2) {
        dVar4 = ::trunc(local_20);
        iVar5 = (int32_t)dVar4;
      }
      else {
        iVar5 = 0x7fffffff - (int)((long)dVar4 >> 0x3f);
      }
    }
    (__return_storage_ptr__->field_0).i32 = iVar5;
  }
  else {
    if (uVar1 != 4) {
      handle_unreachable("invalid type",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                         ,0x314);
    }
    Literal(&local_50,this);
    castToI32(&local_38,&local_50);
    fVar3 = (float)geti32(&local_38);
    local_20 = (double)CONCAT44(local_20._4_4_,fVar3);
    if (NAN(fVar3)) {
      iVar5 = 0;
    }
    else {
      bVar2 = isInRangeI32TruncS((int32_t)fVar3);
      if (bVar2) {
        fVar3 = truncf(local_20._0_4_);
        iVar5 = (int32_t)fVar3;
      }
      else {
        iVar5 = 0x7fffffff - ((int)fVar3 >> 0x1f);
      }
    }
    (__return_storage_ptr__->field_0).i32 = iVar5;
  }
  (__return_storage_ptr__->type).id = 2;
  ~Literal(&local_38);
  ~Literal(&local_50);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::truncSatToSI32() const {
  if (type == Type::f32) {
    return saturating_trunc<float, int32_t, isInRangeI32TruncS>(
      Literal(*this).castToI32().geti32());
  }
  if (type == Type::f64) {
    return saturating_trunc<double, int32_t, isInRangeI32TruncS>(
      Literal(*this).castToI64().geti64());
  }
  WASM_UNREACHABLE("invalid type");
}